

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall
UtestShell::assertCstrNoCaseContains
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,int lineNumber)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SimpleString local_90;
  SimpleString local_88;
  SimpleString local_80;
  int local_74;
  TestFailure local_70;
  TestResult *pTVar3;
  
  pTVar3 = testResult_;
  local_74 = lineNumber;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar2 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x27])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar3 = (TestResult *)CONCAT44(extraout_var,iVar2);
  }
  (*pTVar3->_vptr_TestResult[10])();
  if (expected != (char *)0x0 || actual != (char *)0x0) {
    if (expected == (char *)0x0 || actual == (char *)0x0) {
      SimpleString::SimpleString(&local_90,expected);
      SimpleString::SimpleString(&local_88,actual);
      SimpleString::SimpleString(&local_80,text);
      ContainsFailure::ContainsFailure
                ((ContainsFailure *)&local_70,this,fileName,local_74,&local_90,&local_88,&local_80);
      (*this->_vptr_UtestShell[0x24])(this,&local_70);
      TestFailure::~TestFailure(&local_70);
      SimpleString::~SimpleString(&local_80);
      SimpleString::~SimpleString(&local_88);
      SimpleString::~SimpleString(&local_90);
    }
    SimpleString::SimpleString((SimpleString *)&local_70,actual);
    SimpleString::SimpleString(&local_90,expected);
    bVar1 = SimpleString::containsNoCase((SimpleString *)&local_70,&local_90);
    SimpleString::~SimpleString(&local_90);
    SimpleString::~SimpleString((SimpleString *)&local_70);
    if (!bVar1) {
      SimpleString::SimpleString(&local_90,expected);
      SimpleString::SimpleString(&local_88,actual);
      SimpleString::SimpleString(&local_80,text);
      ContainsFailure::ContainsFailure
                ((ContainsFailure *)&local_70,this,fileName,local_74,&local_90,&local_88,&local_80);
      (*this->_vptr_UtestShell[0x24])(this,&local_70);
      TestFailure::~TestFailure(&local_70);
      SimpleString::~SimpleString(&local_80);
      SimpleString::~SimpleString(&local_88);
      SimpleString::~SimpleString(&local_90);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseContains(const char* expected, const char* actual, const char* text, const char* fileName, int lineNumber)
{
    getTestResult()->countCheck();
    if (actual == 0 && expected == 0) return;
    if(actual == 0 || expected == 0)
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(actual).containsNoCase(expected))
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
}